

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O0

void __thiscall
google::protobuf::util::SimpleFieldComparator::SetFractionAndMargin
          (SimpleFieldComparator *this,FieldDescriptor *field,double fraction,double margin)

{
  CppType CVar1;
  LogMessage *pLVar2;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>
  pTVar3;
  bool bVar4;
  Tolerance local_78;
  string_view local_68;
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  double local_28;
  double margin_local;
  double fraction_local;
  FieldDescriptor *field_local;
  SimpleFieldComparator *this_local;
  
  local_28 = margin;
  margin_local = fraction;
  fraction_local = (double)field;
  field_local = (FieldDescriptor *)this;
  CVar1 = FieldDescriptor::cpp_type(field);
  local_41 = 0;
  bVar4 = true;
  if (CVar1 != CPPTYPE_FLOAT) {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)fraction_local);
    bVar4 = CVar1 == CPPTYPE_DOUBLE;
  }
  if (!bVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator.cc"
               ,0xa3,
               "FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() || FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type()"
              );
    local_41 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [54])
                               "Field has to be float or double type. Field name is: ");
    local_68 = FieldDescriptor::full_name((FieldDescriptor *)fraction_local);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  Tolerance::Tolerance(&local_78,margin_local,local_28);
  pTVar3 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
           ::
           operator[]<google::protobuf::FieldDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
                       *)&this->map_tolerance_,
                      (key_arg<const_google::protobuf::FieldDescriptor_*> *)&fraction_local);
  pTVar3->fraction = local_78.fraction;
  pTVar3->margin = local_78.margin;
  return;
}

Assistant:

void SimpleFieldComparator::SetFractionAndMargin(const FieldDescriptor* field,
                                                 double fraction,
                                                 double margin) {
  ABSL_CHECK(FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() ||
             FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type())
      << "Field has to be float or double type. Field name is: "
      << field->full_name();
  map_tolerance_[field] = Tolerance(fraction, margin);
}